

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

bool GetControl<unsigned_int>(Services *OS,char *name,uint *value)

{
  bool bVar1;
  undefined4 *in_RDX;
  char *in_RSI;
  size_t in_stack_00000030;
  void *in_stack_00000038;
  string *in_stack_00000040;
  Services_Common *in_stack_00000048;
  bool success;
  uint readValue;
  allocator local_41;
  string local_40 [36];
  undefined4 local_1c;
  undefined4 *local_18;
  
  local_1c = 0;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  bVar1 = ::OS::Services_Common::GetControl
                    (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar1) {
    *local_18 = local_1c;
  }
  return bVar1;
}

Assistant:

static bool GetControl(
    const OS::Services& OS,
    const char* name,
    T& value )
{
    unsigned int    readValue = 0;
    bool success = OS.GetControl( name, &readValue, sizeof(readValue) );
    if( success )
    {
        value = readValue;
    }

    return success;
}